

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_preprocessor.c
# Opt level: O2

int handle_pp_identifier(Context_conflict1 *ctx)

{
  void *pvVar1;
  MOJOSHADER_free p_Var2;
  long lVar3;
  bool bVar4;
  Token TVar5;
  int iVar6;
  uint uVar7;
  Token TVar8;
  Define *pDVar9;
  size_t sVar10;
  size_t sVar11;
  char *pcVar12;
  char *pcVar13;
  ulong uVar14;
  Buffer *pBVar15;
  uint uVar16;
  long lVar17;
  char *pcVar18;
  char *pcVar19;
  char *pcVar20;
  char *pcVar21;
  char *pcVar22;
  char *pcVar23;
  char *pcVar24;
  char *pcVar25;
  char *pcVar26;
  char *pcVar27;
  char *pcVar28;
  char *pcVar29;
  char *pcVar30;
  char *pcVar31;
  char *pcVar32;
  char *pcVar33;
  char *pcVar34;
  char *pcVar35;
  char *pcVar36;
  char *pcVar37;
  char *pcVar38;
  char *pcVar39;
  char *pcVar40;
  char *pcVar41;
  char *pcVar42;
  char *pcVar43;
  char *pcVar44;
  char *pcVar45;
  char *pcVar46;
  char *pcVar47;
  char *pcVar48;
  char *pcVar49;
  char *pcVar50;
  char *pcVar51;
  char *pcVar52;
  char *pcVar53;
  char *pcVar54;
  char *pcVar55;
  char *pcVar56;
  char *pcVar57;
  char *pcVar58;
  char *pcVar59;
  char *pcVar60;
  char *pcVar61;
  char *pcVar62;
  char *pcVar63;
  char *pcVar64;
  char *pcVar65;
  char *pcVar66;
  char *pcVar67;
  char *pcVar68;
  char *pcVar69;
  char *pcVar70;
  char *pcVar71;
  char *pcVar72;
  char *pcVar73;
  char *pcVar74;
  char *pcVar75;
  char *pcVar76;
  char *pcVar77;
  char *pcVar78;
  char *pcVar79;
  char *pcVar80;
  char *pcVar81;
  char *pcVar82;
  char *pcVar83;
  char *pcVar84;
  char *pcVar85;
  char *pcVar86;
  char *pcVar87;
  char *pcVar88;
  IncludeState *pIVar89;
  Buffer *pBVar90;
  char *sym;
  size_t len;
  IncludeState *pIVar91;
  undefined8 uVar92;
  int iVar93;
  Define *defines;
  byte bVar94;
  ulong uStack_100;
  char local_f8 [104];
  char *local_90;
  size_t local_88;
  size_t local_80;
  long local_78;
  Define *local_70;
  long local_68;
  int local_5c;
  Buffer *local_58;
  ulong local_50;
  IncludeState *local_48;
  byte local_39;
  Buffer *local_38;
  
  bVar94 = 0;
  iVar6 = ctx->recursion_count;
  ctx->recursion_count = iVar6 + 1;
  if (iVar6 < 0x100) {
    pIVar91 = ctx->include_stack;
    pcVar12 = pIVar91->filename;
    uVar7 = pIVar91->line;
    uVar16 = pIVar91->tokenlen;
    lVar3 = -((ulong)(uVar16 + 1) + 0xf & 0xfffffffffffffff0);
    sym = local_f8 + lVar3;
    pcVar13 = pIVar91->token;
    pcVar18 = local_f8 + lVar3 + -8;
    pcVar18[0] = '-';
    pcVar18[1] = -0x66;
    pcVar18[2] = '\x12';
    pcVar18[3] = '\0';
    pcVar18[4] = '\0';
    pcVar18[5] = '\0';
    pcVar18[6] = '\0';
    pcVar18[7] = '\0';
    memcpy(sym,pcVar13,(ulong)uVar16);
    sym[uVar16] = '\0';
    pcVar19 = local_f8 + lVar3 + -8;
    pcVar19[0] = '>';
    pcVar19[1] = -0x66;
    pcVar19[2] = '\x12';
    pcVar19[3] = '\0';
    pcVar19[4] = '\0';
    pcVar19[5] = '\0';
    pcVar19[6] = '\0';
    pcVar19[7] = '\0';
    local_70 = find_define(ctx,sym);
    if (local_70 != (Define *)0x0) {
      iVar6 = local_70->paramcount;
      if ((long)iVar6 == 0) {
        pcVar13 = local_70->definition;
        pcVar42 = local_f8 + lVar3 + -8;
        pcVar42[0] = 'x';
        pcVar42[1] = -99;
        pcVar42[2] = '\x12';
        pcVar42[3] = '\0';
        pcVar42[4] = '\0';
        pcVar42[5] = '\0';
        pcVar42[6] = '\0';
        pcVar42[7] = '\0';
        sVar10 = strlen(pcVar13);
        iVar6 = push_source(ctx,pcVar12,pcVar13,(uint)sVar10,uVar7,(MOJOSHADER_includeClose)0x0);
        return iVar6;
      }
      local_90 = sym;
      pIVar91 = ctx->include_stack;
      uVar92 = 0;
      local_78 = (long)iVar6;
      iVar93 = 0;
      if (0 < iVar6) {
        iVar93 = iVar6;
      }
      pcVar20 = local_f8 + lVar3 + -8;
      pcVar20[0] = '\r';
      pcVar20[1] = '\0';
      pcVar20[2] = '\0';
      pcVar20[3] = '\0';
      pcVar20[4] = '\0';
      pcVar20[5] = '\0';
      pcVar20[6] = '\0';
      pcVar20[7] = '\0';
      pIVar89 = pIVar91;
      pcVar12 = local_f8;
      for (lVar17 = *(long *)(local_f8 + lVar3 + -8); lVar17 != 0; lVar17 = lVar17 + -1) {
        *(char **)pcVar12 = pIVar89->filename;
        pIVar89 = (IncludeState *)((long)pIVar89 + (ulong)bVar94 * -0x10 + 8);
        pcVar12 = pcVar12 + ((ulong)bVar94 * -2 + 1) * 8;
      }
      pcVar21 = local_f8 + lVar3 + -8;
      pcVar21[0] = -0x6f;
      pcVar21[1] = -0x66;
      pcVar21[2] = '\x12';
      pcVar21[3] = '\0';
      pcVar21[4] = '\0';
      pcVar21[5] = '\0';
      pcVar21[6] = '\0';
      pcVar21[7] = '\0';
      TVar5 = lexer(pIVar91);
      if (TVar5 != 0x28) {
        pcVar43 = local_f8 + lVar3 + -8;
        pcVar43[0] = '\r';
        pcVar43[1] = '\0';
        pcVar43[2] = '\0';
        pcVar43[3] = '\0';
        pcVar43[4] = '\0';
        pcVar43[5] = '\0';
        pcVar43[6] = '\0';
        pcVar43[7] = '\0';
        pcVar12 = local_f8;
        pIVar89 = pIVar91;
        for (lVar17 = *(long *)(local_f8 + lVar3 + -8); lVar17 != 0; lVar17 = lVar17 + -1) {
          pIVar89->filename = *(char **)pcVar12;
          pcVar12 = pcVar12 + ((ulong)bVar94 * -2 + 1) * 8;
          pIVar89 = (IncludeState *)((long)pIVar89 + (ulong)bVar94 * -0x10 + 8);
        }
        defines = (Define *)0x0;
LAB_0012a103:
        while (defines != (Define *)0x0) {
          pDVar9 = defines->next;
          defines->identifier = (char *)0x0;
          pcVar83 = local_f8 + lVar3 + -8;
          pcVar83[0] = '\0';
          pcVar83[1] = -0x5f;
          pcVar83[2] = '\x12';
          pcVar83[3] = '\0';
          pcVar83[4] = '\0';
          pcVar83[5] = '\0';
          pcVar83[6] = '\0';
          pcVar83[7] = '\0';
          free_define(ctx,defines);
          defines = pDVar9;
        }
        pIVar91->report_whitespace = 0;
        return (int)uVar92;
      }
      local_5c = iVar93;
      pIVar91->report_whitespace = 1;
      lVar17 = 0;
      pcVar22 = local_f8 + lVar3 + -8;
      pcVar22[0] = '\x01';
      pcVar22[1] = '\0';
      pcVar22[2] = '\0';
      pcVar22[3] = '\0';
      pcVar22[4] = '\0';
      pcVar22[5] = '\0';
      pcVar22[6] = '\0';
      pcVar22[7] = '\0';
      uVar14 = *(ulong *)(local_f8 + lVar3 + -8);
      bVar94 = 0;
      defines = (Define *)0x0;
      local_48 = pIVar91;
LAB_00129ab6:
      pIVar91 = local_48;
      pcVar12 = local_90;
      iVar6 = (int)uVar14;
      if (0 < iVar6) {
        local_50 = CONCAT44(local_50._4_4_,iVar6);
        pcVar23 = local_f8 + lVar3 + -8;
        local_68 = lVar17;
        pcVar23[0] = -0x1a;
        pcVar23[1] = -0x66;
        pcVar23[2] = '\x12';
        pcVar23[3] = '\0';
        pcVar23[4] = '\0';
        pcVar23[5] = '\0';
        pcVar23[6] = '\0';
        pcVar23[7] = '\0';
        local_38 = buffer_create(0x80,MallocBridge,FreeBridge,ctx);
        pcVar24 = local_f8 + lVar3 + -8;
        pcVar24[0] = '\x01';
        pcVar24[1] = -0x65;
        pcVar24[2] = '\x12';
        pcVar24[3] = '\0';
        pcVar24[4] = '\0';
        pcVar24[5] = '\0';
        pcVar24[6] = '\0';
        pcVar24[7] = '\0';
        local_58 = buffer_create(0x80,MallocBridge,FreeBridge,ctx);
        pcVar25 = local_f8 + lVar3 + -8;
        pcVar25[0] = '\r';
        pcVar25[1] = -0x65;
        pcVar25[2] = '\x12';
        pcVar25[3] = '\0';
        pcVar25[4] = '\0';
        pcVar25[5] = '\0';
        pcVar25[6] = '\0';
        pcVar25[7] = '\0';
        TVar5 = lexer(pIVar91);
        if (bVar94 != 0) {
          pcVar85 = local_f8 + lVar3 + -8;
          pcVar85[0] = '^';
          pcVar85[1] = -0x5f;
          pcVar85[2] = '\x12';
          pcVar85[3] = '\0';
          pcVar85[4] = '\0';
          pcVar85[5] = '\0';
          pcVar85[6] = '\0';
          pcVar85[7] = '\0';
          __assert_fail("!void_call",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_preprocessor.c"
                        ,0x563,"int handle_macro_args(Context *, const char *, const Define *)");
        }
        local_50 = local_50 & 0xffffffff;
        pIVar89 = pIVar91;
        do {
          pIVar91 = local_48;
          pBVar15 = local_58;
          if (TVar5 == 0x20) {
            pcVar30 = local_f8 + lVar3 + -8;
            pcVar30[0] = '\x15';
            pcVar30[1] = -100;
            pcVar30[2] = '\x12';
            pcVar30[3] = '\0';
            pcVar30[4] = '\0';
            pcVar30[5] = '\0';
            pcVar30[6] = '\0';
            pcVar30[7] = '\0';
            sVar11 = buffer_size(pBVar15);
            pBVar15 = local_38;
            len = (size_t)(sVar11 != 0);
            pcVar31 = local_f8 + lVar3 + -8;
            pcVar31[0] = '(';
            pcVar31[1] = -100;
            pcVar31[2] = '\x12';
            pcVar31[3] = '\0';
            pcVar31[4] = '\0';
            pcVar31[5] = '\0';
            pcVar31[6] = '\0';
            pcVar31[7] = '\0';
            sVar11 = buffer_size(pBVar15);
            uVar7 = (uint)(sVar11 != 0);
            pcVar13 = " ";
            pcVar12 = pcVar13;
          }
          else {
            pcVar12 = pIVar89->token;
            uVar7 = pIVar89->tokenlen;
            len = (size_t)uVar7;
            iVar6 = (int)local_50;
            pcVar13 = pcVar12;
            if (TVar5 == 0x28) {
              local_50 = (ulong)(iVar6 + 1);
            }
            else if (TVar5 == 0x29) {
              uVar16 = iVar6 - 1;
              local_50 = (ulong)uVar16;
              if (iVar6 < 2) goto LAB_00129c53;
            }
            else if (TVar5 == 0x2c) {
              if (iVar6 == 1) goto LAB_00129c50;
            }
            else if (TVar5 == TOKEN_IDENTIFIER) {
              pcVar26 = local_f8 + lVar3 + -8;
              pcVar26[0] = -0x67;
              pcVar26[1] = -0x65;
              pcVar26[2] = '\x12';
              pcVar26[3] = '\0';
              pcVar26[4] = '\0';
              pcVar26[5] = '\0';
              pcVar26[6] = '\0';
              pcVar26[7] = '\0';
              pDVar9 = find_define_by_token(ctx);
              if ((pDVar9 != (Define *)0x0) && (pDVar9->paramcount == 0)) {
                pcVar13 = pDVar9->definition;
                pcVar32 = local_f8 + lVar3 + -8;
                pcVar32[0] = 'K';
                pcVar32[1] = -100;
                pcVar32[2] = '\x12';
                pcVar32[3] = '\0';
                pcVar32[4] = '\0';
                pcVar32[5] = '\0';
                pcVar32[6] = '\0';
                pcVar32[7] = '\0';
                sVar10 = strlen(pcVar13);
                uVar7 = (uint)sVar10;
              }
            }
            else if ((TVar5 == TOKEN_EOI) || (TVar5 == TOKEN_INCOMPLETE_COMMENT)) {
              pcVar44 = local_f8 + lVar3 + -8;
              builtin_strncpy(local_f8 + lVar3 + -8,"\x1d\x12",4);
              pcVar44[4] = '\0';
              pcVar44[5] = '\0';
              pcVar44[6] = '\0';
              pcVar44[7] = '\0';
              pushback(pIVar91);
              pcVar45 = local_f8 + lVar3 + -8;
              builtin_strncpy(local_f8 + lVar3 + -8,"ϝ\x12",4);
              pcVar45[4] = '\0';
              pcVar45[5] = '\0';
              pcVar45[6] = '\0';
              pcVar45[7] = '\0';
              fail(ctx,"Unterminated macro list");
              goto LAB_00129dcf;
            }
            if (pcVar13 == (char *)0x0) {
              pcVar84 = local_f8 + lVar3 + -8;
              pcVar84[0] = '?';
              pcVar84[1] = -0x5f;
              pcVar84[2] = '\x12';
              pcVar84[3] = '\0';
              pcVar84[4] = '\0';
              pcVar84[5] = '\0';
              pcVar84[6] = '\0';
              pcVar84[7] = '\0';
              __assert_fail("expr != NULL",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_preprocessor.c"
                            ,0x597,"int handle_macro_args(Context *, const char *, const Define *)")
              ;
            }
          }
          pBVar15 = local_38;
          pcVar27 = local_f8 + lVar3 + -8;
          builtin_strncpy(local_f8 + lVar3 + -8,"כ\x12",4);
          pcVar27[4] = '\0';
          pcVar27[5] = '\0';
          pcVar27[6] = '\0';
          pcVar27[7] = '\0';
          iVar6 = buffer_append(pBVar15,pcVar13,(ulong)uVar7);
          pBVar15 = local_58;
          uVar92 = 0;
          pIVar91 = local_48;
          if (iVar6 == 0) goto LAB_0012a103;
          pcVar28 = local_f8 + lVar3 + -8;
          pcVar28[0] = -0xf;
          pcVar28[1] = -0x65;
          pcVar28[2] = '\x12';
          pcVar28[3] = '\0';
          pcVar28[4] = '\0';
          pcVar28[5] = '\0';
          pcVar28[6] = '\0';
          pcVar28[7] = '\0';
          iVar6 = buffer_append(pBVar15,pcVar12,len);
          pIVar89 = local_48;
          pIVar91 = local_48;
          if (iVar6 == 0) goto LAB_0012a103;
          pcVar29 = local_f8 + lVar3 + -8;
          pcVar29[0] = '\x05';
          pcVar29[1] = -100;
          pcVar29[2] = '\x12';
          pcVar29[3] = '\0';
          pcVar29[4] = '\0';
          pcVar29[5] = '\0';
          pcVar29[6] = '\0';
          pcVar29[7] = '\0';
          TVar5 = lexer(pIVar89);
        } while( true );
      }
      if (iVar6 != 0) {
        pcVar87 = local_f8 + lVar3 + -8;
        pcVar87[0] = -100;
        pcVar87[1] = -0x5f;
        pcVar87[2] = '\x12';
        pcVar87[3] = '\0';
        pcVar87[4] = '\0';
        pcVar87[5] = '\0';
        pcVar87[6] = '\0';
        pcVar87[7] = '\0';
        __assert_fail("paren == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_preprocessor.c"
                      ,0x5d4,"int handle_macro_args(Context *, const char *, const Define *)");
      }
      if (((((int)local_78 < 1) && (lVar17 == 1)) && (bVar94 != 0)) &&
         (lVar17 = 0, defines != (Define *)0x0)) {
        *(code **)(local_f8 + lVar3 + -8) = failf;
        __assert_fail("params == NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_preprocessor.c"
                      ,0x5d9,"int handle_macro_args(Context *, const char *, const Define *)");
      }
      if ((int)lVar17 != local_5c) {
        uVar92 = 0;
        pcVar67 = local_f8 + lVar3 + -8;
        pcVar67[0] = '\x12';
        pcVar67[1] = -0x60;
        pcVar67[2] = '\x12';
        pcVar67[3] = '\0';
        pcVar67[4] = '\0';
        pcVar67[5] = '\0';
        pcVar67[6] = '\0';
        pcVar67[7] = '\0';
        failf(ctx,"macro \'%s\' passed %d arguments, but requires %d",pcVar12);
        goto LAB_0012a103;
      }
      pcVar46 = local_f8 + lVar3 + -8;
      pcVar46[0] = '!';
      pcVar46[1] = -0x62;
      pcVar46[2] = '\x12';
      pcVar46[3] = '\0';
      pcVar46[4] = '\0';
      pcVar46[5] = '\0';
      pcVar46[6] = '\0';
      pcVar46[7] = '\0';
      local_38 = buffer_create(0x80,MallocBridge,FreeBridge,ctx);
      if (local_38 == (Buffer *)0x0) {
LAB_00129dcf:
        uVar92 = 0;
        goto LAB_0012a103;
      }
      pIVar91 = ctx->include_stack;
      pcVar12 = pIVar91->filename;
      pcVar13 = local_70->definition;
      pcVar47 = local_f8 + lVar3 + -8;
      pcVar47[0] = 'E';
      pcVar47[1] = -0x62;
      pcVar47[2] = '\x12';
      pcVar47[3] = '\0';
      pcVar47[4] = '\0';
      pcVar47[5] = '\0';
      pcVar47[6] = '\0';
      pcVar47[7] = '\0';
      sVar10 = strlen(pcVar13);
      uVar7 = pIVar91->line;
      uVar92 = 0;
      pcVar48 = local_f8 + lVar3 + -8;
      pcVar48[0] = '_';
      pcVar48[1] = -0x62;
      pcVar48[2] = '\x12';
      pcVar48[3] = '\0';
      pcVar48[4] = '\0';
      pcVar48[5] = '\0';
      pcVar48[6] = '\0';
      pcVar48[7] = '\0';
      iVar6 = push_source(ctx,pcVar12,pcVar13,(uint)sVar10,uVar7,(MOJOSHADER_includeClose)0x0);
      pBVar15 = local_38;
      if (iVar6 == 0) {
        pcVar68 = local_f8 + lVar3 + -8;
        pcVar68[0] = ' ';
        pcVar68[1] = -0x60;
        pcVar68[2] = '\x12';
        pcVar68[3] = '\0';
        pcVar68[4] = '\0';
        pcVar68[5] = '\0';
        pcVar68[6] = '\0';
        pcVar68[7] = '\0';
        buffer_destroy(pBVar15);
        pIVar91 = local_48;
        goto LAB_0012a103;
      }
      pIVar91 = ctx->include_stack;
      while( true ) {
        pcVar49 = local_f8 + lVar3 + -8;
        pcVar49[0] = 'v';
        pcVar49[1] = -0x62;
        pcVar49[2] = '\x12';
        pcVar49[3] = '\0';
        pcVar49[4] = '\0';
        pcVar49[5] = '\0';
        pcVar49[6] = '\0';
        pcVar49[7] = '\0';
        TVar5 = lexer(pIVar91);
        pBVar15 = local_38;
        if (TVar5 == TOKEN_EOI) {
          pcVar69 = local_f8 + lVar3 + -8;
          pcVar69[0] = '.';
          pcVar69[1] = -0x60;
          pcVar69[2] = '\x12';
          pcVar69[3] = '\0';
          pcVar69[4] = '\0';
          pcVar69[5] = '\0';
          pcVar69[6] = '\0';
          pcVar69[7] = '\0';
          pcVar12 = buffer_flatten(pBVar15);
          pBVar15 = local_38;
          if (pcVar12 == (char *)0x0) goto LAB_0012a07f;
          pcVar70 = local_f8 + lVar3 + -8;
          pcVar70[0] = '?';
          pcVar70[1] = -0x60;
          pcVar70[2] = '\x12';
          pcVar70[3] = '\0';
          pcVar70[4] = '\0';
          pcVar70[5] = '\0';
          pcVar70[6] = '\0';
          pcVar70[7] = '\0';
          buffer_destroy(pBVar15);
          pcVar71 = local_f8 + lVar3 + -8;
          pcVar71[0] = 'G';
          pcVar71[1] = -0x60;
          pcVar71[2] = '\x12';
          pcVar71[3] = '\0';
          pcVar71[4] = '\0';
          pcVar71[5] = '\0';
          pcVar71[6] = '\0';
          pcVar71[7] = '\0';
          pop_source(ctx);
          pIVar91 = ctx->include_stack;
          pcVar13 = pIVar91->filename;
          pcVar72 = local_f8 + lVar3 + -8;
          pcVar72[0] = 'Z';
          pcVar72[1] = -0x60;
          pcVar72[2] = '\x12';
          pcVar72[3] = '\0';
          pcVar72[4] = '\0';
          pcVar72[5] = '\0';
          pcVar72[6] = '\0';
          pcVar72[7] = '\0';
          sVar10 = strlen(pcVar12);
          uVar7 = pIVar91->line;
          pcVar73 = local_f8 + lVar3 + -8;
          pcVar73[0] = 'u';
          pcVar73[1] = -0x60;
          pcVar73[2] = '\x12';
          pcVar73[3] = '\0';
          pcVar73[4] = '\0';
          pcVar73[5] = '\0';
          pcVar73[6] = '\0';
          pcVar73[7] = '\0';
          iVar6 = push_source(ctx,pcVar13,pcVar12,(uint)sVar10,uVar7,close_define_include);
          if (iVar6 != 0) {
            pcVar74 = local_f8 + lVar3 + -8;
            pcVar74[0] = '\x01';
            pcVar74[1] = '\0';
            pcVar74[2] = '\0';
            pcVar74[3] = '\0';
            pcVar74[4] = '\0';
            pcVar74[5] = '\0';
            pcVar74[6] = '\0';
            pcVar74[7] = '\0';
            uVar92 = *(undefined8 *)(local_f8 + lVar3 + -8);
            pIVar91 = local_48;
            goto LAB_0012a103;
          }
          pvVar1 = ctx->malloc_data;
          p_Var2 = ctx->free;
          pcVar82 = local_f8 + lVar3 + -8;
          pcVar82[0] = -0x1c;
          pcVar82[1] = -0x60;
          pcVar82[2] = '\x12';
          pcVar82[3] = '\0';
          pcVar82[4] = '\0';
          pcVar82[5] = '\0';
          pcVar82[6] = '\0';
          pcVar82[7] = '\0';
          (*p_Var2)(pcVar12,pvVar1);
          goto LAB_0012a0e4;
        }
        TVar5 = pIVar91->tokenval;
        if (TVar5 == TOKEN_HASHHASH) {
          pcVar50 = local_f8 + lVar3 + -8;
          pcVar50[0] = -0x6a;
          pcVar50[1] = -0x62;
          pcVar50[2] = '\x12';
          pcVar50[3] = '\0';
          pcVar50[4] = '\0';
          pcVar50[5] = '\0';
          pcVar50[6] = '\0';
          pcVar50[7] = '\0';
          lexer(pIVar91);
          TVar8 = pIVar91->tokenval;
          if (TVar8 == TOKEN_EOI) {
            pcVar86 = local_f8 + lVar3 + -8;
            pcVar86[0] = '}';
            pcVar86[1] = -0x5f;
            pcVar86[2] = '\x12';
            pcVar86[3] = '\0';
            pcVar86[4] = '\0';
            pcVar86[5] = '\0';
            pcVar86[6] = '\0';
            pcVar86[7] = '\0';
            __assert_fail("state->tokenval != TOKEN_EOI",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_preprocessor.c"
                          ,0x4f6,
                          "int replace_and_push_macro(Context *, const Define *, const Define *)");
          }
        }
        else {
          pcVar51 = local_f8 + lVar3 + -8;
          pcVar51[0] = -0x51;
          pcVar51[1] = -0x62;
          pcVar51[2] = '\x12';
          pcVar51[3] = '\0';
          pcVar51[4] = '\0';
          pcVar51[5] = '\0';
          pcVar51[6] = '\0';
          pcVar51[7] = '\0';
          sVar11 = buffer_size(pBVar15);
          pBVar15 = local_38;
          if (sVar11 != 0) {
            pcVar52 = local_f8 + lVar3 + -8;
            pcVar52[0] = '\x01';
            pcVar52[1] = '\0';
            pcVar52[2] = '\0';
            pcVar52[3] = '\0';
            pcVar52[4] = '\0';
            pcVar52[5] = '\0';
            pcVar52[6] = '\0';
            pcVar52[7] = '\0';
            sVar11 = *(size_t *)(local_f8 + lVar3 + -8);
            pcVar53 = local_f8 + lVar3 + -8;
            builtin_strncpy(local_f8 + lVar3 + -8,"Ǟ\x12",4);
            pcVar53[4] = '\0';
            pcVar53[5] = '\0';
            pcVar53[6] = '\0';
            pcVar53[7] = '\0';
            iVar6 = buffer_append(pBVar15," ",sVar11);
            if (iVar6 == 0) goto LAB_0012a07f;
          }
          TVar8 = pIVar91->tokenval;
        }
        pcVar12 = pIVar91->token;
        pBVar15 = (Buffer *)(ulong)pIVar91->tokenlen;
        if (TVar8 != TOKEN_IDENTIFIER) break;
        pcVar61 = local_f8 + lVar3 + -8;
        local_58 = pBVar15;
        pcVar61[0] = -0x79;
        pcVar61[1] = -0x61;
        pcVar61[2] = '\x12';
        pcVar61[3] = '\0';
        pcVar61[4] = '\0';
        pcVar61[5] = '\0';
        pcVar61[6] = '\0';
        pcVar61[7] = '\0';
        pDVar9 = find_macro_arg(pIVar91,defines);
        pBVar15 = local_58;
        if (pDVar9 != (Define *)0x0) {
          pcVar62 = local_f8 + lVar3 + -8;
          pcVar62[0] = '\x10';
          pcVar62[1] = '\0';
          pcVar62[2] = '\0';
          pcVar62[3] = '\0';
          pcVar62[4] = '\0';
          pcVar62[5] = '\0';
          pcVar62[6] = '\0';
          pcVar62[7] = '\0';
          lVar17 = *(long *)(local_f8 + lVar3 + -8);
          if (TVar5 != TOKEN_HASHHASH) {
            pcVar63 = local_f8 + lVar3 + -8;
            pcVar63[0] = -0x53;
            pcVar63[1] = -0x61;
            pcVar63[2] = '\x12';
            pcVar63[3] = '\0';
            pcVar63[4] = '\0';
            pcVar63[5] = '\0';
            pcVar63[6] = '\0';
            pcVar63[7] = '\0';
            TVar5 = lexer(pIVar91);
            pcVar64 = local_f8 + lVar3 + -8;
            builtin_strncpy(local_f8 + lVar3 + -8,"_\x12",4);
            pcVar64[4] = '\0';
            pcVar64[5] = '\0';
            pcVar64[6] = '\0';
            pcVar64[7] = '\0';
            pushback(pIVar91);
            lVar17 = (ulong)(TVar5 == TOKEN_HASHHASH) * 8 + 8;
          }
          pcVar12 = *(char **)((long)&pDVar9->identifier + lVar17);
          pcVar65 = local_f8 + lVar3 + -8;
          builtin_strncpy(local_f8 + lVar3 + -8,"؟\x12",4);
          pcVar65[4] = '\0';
          pcVar65[5] = '\0';
          pcVar65[6] = '\0';
          pcVar65[7] = '\0';
          pBVar15 = (Buffer *)strlen(pcVar12);
        }
LAB_00129fde:
        sVar11 = (ulong)pBVar15 & 0xffffffff;
        pBVar15 = local_38;
LAB_00129fe5:
        pcVar66 = local_f8 + lVar3 + -8;
        pcVar66[0] = -0x16;
        pcVar66[1] = -0x61;
        pcVar66[2] = '\x12';
        pcVar66[3] = '\0';
        pcVar66[4] = '\0';
        pcVar66[5] = '\0';
        pcVar66[6] = '\0';
        pcVar66[7] = '\0';
        iVar6 = buffer_append(pBVar15,pcVar12,sVar11);
        if (iVar6 == 0) {
LAB_0012a07f:
          pcVar75 = local_f8 + lVar3 + -8;
          pcVar75[0] = -0x79;
          pcVar75[1] = -0x60;
          pcVar75[2] = '\x12';
          pcVar75[3] = '\0';
          pcVar75[4] = '\0';
          pcVar75[5] = '\0';
          pcVar75[6] = '\0';
          pcVar75[7] = '\0';
          pop_source(ctx);
          pBVar15 = local_38;
          pcVar76 = local_f8 + lVar3 + -8;
          pcVar76[0] = -0x70;
          pcVar76[1] = -0x60;
          pcVar76[2] = '\x12';
          pcVar76[3] = '\0';
          pcVar76[4] = '\0';
          pcVar76[5] = '\0';
          pcVar76[6] = '\0';
          pcVar76[7] = '\0';
          buffer_destroy(pBVar15);
LAB_0012a0e4:
          uVar92 = 0;
          pIVar91 = local_48;
          goto LAB_0012a103;
        }
      }
      if (TVar8 != TOKEN_HASH) goto LAB_00129fde;
      pcVar54 = local_f8 + lVar3 + -8;
      pcVar54[0] = -4;
      pcVar54[1] = -0x62;
      pcVar54[2] = '\x12';
      pcVar54[3] = '\0';
      pcVar54[4] = '\0';
      pcVar54[5] = '\0';
      pcVar54[6] = '\0';
      pcVar54[7] = '\0';
      lexer(pIVar91);
      pBVar90 = local_38;
      if (pIVar91->tokenval == TOKEN_EOI) {
        pcVar88 = local_f8 + lVar3 + -8;
        pcVar88[0] = -0x45;
        pcVar88[1] = -0x5f;
        pcVar88[2] = '\x12';
        pcVar88[3] = '\0';
        pcVar88[4] = '\0';
        pcVar88[5] = '\0';
        pcVar88[6] = '\0';
        pcVar88[7] = '\0';
        __assert_fail("state->tokenval != TOKEN_EOI",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_preprocessor.c"
                      ,0x507,"int replace_and_push_macro(Context *, const Define *, const Define *)"
                     );
      }
      pcVar55 = local_f8 + lVar3 + -8;
      pcVar55[0] = '\x01';
      pcVar55[1] = '\0';
      pcVar55[2] = '\0';
      pcVar55[3] = '\0';
      pcVar55[4] = '\0';
      pcVar55[5] = '\0';
      pcVar55[6] = '\0';
      pcVar55[7] = '\0';
      sVar11 = *(size_t *)(local_f8 + lVar3 + -8);
      pcVar56 = local_f8 + lVar3 + -8;
      pcVar56[0] = '\x1d';
      pcVar56[1] = -0x61;
      pcVar56[2] = '\x12';
      pcVar56[3] = '\0';
      pcVar56[4] = '\0';
      pcVar56[5] = '\0';
      pcVar56[6] = '\0';
      pcVar56[7] = '\0';
      iVar6 = buffer_append(pBVar90,"\"",sVar11);
      if (iVar6 != 0) {
        if (pIVar91->tokenval == TOKEN_IDENTIFIER) {
          pcVar57 = local_f8 + lVar3 + -8;
          pcVar57[0] = ':';
          pcVar57[1] = -0x61;
          pcVar57[2] = '\x12';
          pcVar57[3] = '\0';
          pcVar57[4] = '\0';
          pcVar57[5] = '\0';
          pcVar57[6] = '\0';
          pcVar57[7] = '\0';
          pDVar9 = find_macro_arg(pIVar91,defines);
          if (pDVar9 != (Define *)0x0) {
            pcVar12 = pDVar9->original;
            pcVar58 = local_f8 + lVar3 + -8;
            pcVar58[0] = 'K';
            pcVar58[1] = -0x61;
            pcVar58[2] = '\x12';
            pcVar58[3] = '\0';
            pcVar58[4] = '\0';
            pcVar58[5] = '\0';
            pcVar58[6] = '\0';
            pcVar58[7] = '\0';
            pBVar15 = (Buffer *)strlen(pcVar12);
          }
        }
        pBVar90 = local_38;
        pcVar59 = local_f8 + lVar3 + -8;
        pcVar59[0] = ']';
        pcVar59[1] = -0x61;
        pcVar59[2] = '\x12';
        pcVar59[3] = '\0';
        pcVar59[4] = '\0';
        pcVar59[5] = '\0';
        pcVar59[6] = '\0';
        pcVar59[7] = '\0';
        iVar6 = buffer_append(pBVar90,pcVar12,(ulong)pBVar15 & 0xffffffff);
        pBVar15 = local_38;
        if (iVar6 == 0) goto LAB_0012a07f;
        pcVar12 = "\"";
        pcVar60 = local_f8 + lVar3 + -8;
        pcVar60[0] = '\x01';
        pcVar60[1] = '\0';
        pcVar60[2] = '\0';
        pcVar60[3] = '\0';
        pcVar60[4] = '\0';
        pcVar60[5] = '\0';
        pcVar60[6] = '\0';
        pcVar60[7] = '\0';
        sVar11 = *(size_t *)(local_f8 + lVar3 + -8);
        goto LAB_00129fe5;
      }
      goto LAB_0012a07f;
    }
  }
  else {
    uStack_100 = 0x1299f2;
    fail(ctx,"Recursing macros");
  }
  return 0;
LAB_00129c50:
  pcVar33 = local_f8 + lVar3 + -8;
  pcVar33[0] = '\x01';
  pcVar33[1] = '\0';
  pcVar33[2] = '\0';
  pcVar33[3] = '\0';
  pcVar33[4] = '\0';
  pcVar33[5] = '\0';
  pcVar33[6] = '\0';
  pcVar33[7] = '\0';
  uVar16 = (uint)*(undefined8 *)(local_f8 + lVar3 + -8);
LAB_00129c53:
  pBVar90 = local_38;
  pcVar34 = local_f8 + lVar3 + -8;
  pcVar34[0] = 'b';
  pcVar34[1] = -100;
  pcVar34[2] = '\x12';
  pcVar34[3] = '\0';
  pcVar34[4] = '\0';
  pcVar34[5] = '\0';
  pcVar34[6] = '\0';
  pcVar34[7] = '\0';
  sVar11 = buffer_size(pBVar90);
  pBVar15 = local_58;
  local_50 = CONCAT44(local_50._4_4_,uVar16);
  bVar94 = uVar16 == 0;
  bVar4 = local_68 == 0;
  if (local_68 < local_78) {
    pcVar35 = local_f8 + lVar3 + -8;
    local_39 = bVar94;
    pcVar35[0] = -0x74;
    pcVar35[1] = -100;
    pcVar35[2] = '\x12';
    pcVar35[3] = '\0';
    pcVar35[4] = '\0';
    pcVar35[5] = '\0';
    pcVar35[6] = '\0';
    pcVar35[7] = '\0';
    local_88 = buffer_size(pBVar15);
    pcVar36 = local_f8 + lVar3 + -8;
    pcVar36[0] = -0x68;
    pcVar36[1] = -100;
    pcVar36[2] = '\x12';
    pcVar36[3] = '\0';
    pcVar36[4] = '\0';
    pcVar36[5] = '\0';
    pcVar36[6] = '\0';
    pcVar36[7] = '\0';
    pcVar12 = buffer_flatten(pBVar15);
    pcVar37 = local_f8 + lVar3 + -8;
    pcVar37[0] = -0x5d;
    pcVar37[1] = -100;
    pcVar37[2] = '\x12';
    pcVar37[3] = '\0';
    pcVar37[4] = '\0';
    pcVar37[5] = '\0';
    pcVar37[6] = '\0';
    pcVar37[7] = '\0';
    local_80 = buffer_size(pBVar90);
    pcVar38 = local_f8 + lVar3 + -8;
    pcVar38[0] = -0x51;
    pcVar38[1] = -100;
    pcVar38[2] = '\x12';
    pcVar38[3] = '\0';
    pcVar38[4] = '\0';
    pcVar38[5] = '\0';
    pcVar38[6] = '\0';
    pcVar38[7] = '\0';
    pcVar13 = buffer_flatten(pBVar90);
    pcVar39 = local_f8 + lVar3 + -8;
    pcVar39[0] = -0x46;
    pcVar39[1] = -100;
    pcVar39[2] = '\x12';
    pcVar39[3] = '\0';
    pcVar39[4] = '\0';
    pcVar39[5] = '\0';
    pcVar39[6] = '\0';
    pcVar39[7] = '\0';
    pDVar9 = get_define(ctx);
    if (((pcVar12 == (char *)0x0) || (pcVar13 == (char *)0x0)) || (pDVar9 == (Define *)0x0)) {
      pvVar1 = ctx->malloc_data;
      p_Var2 = ctx->free;
      pcVar77 = local_f8 + lVar3 + -8;
      pcVar77[0] = -0x5b;
      pcVar77[1] = -0x60;
      pcVar77[2] = '\x12';
      pcVar77[3] = '\0';
      pcVar77[4] = '\0';
      pcVar77[5] = '\0';
      pcVar77[6] = '\0';
      pcVar77[7] = '\0';
      (*p_Var2)(pcVar12,pvVar1);
      pvVar1 = ctx->malloc_data;
      p_Var2 = ctx->free;
      pcVar78 = local_f8 + lVar3 + -8;
      pcVar78[0] = -0x4b;
      pcVar78[1] = -0x60;
      pcVar78[2] = '\x12';
      pcVar78[3] = '\0';
      pcVar78[4] = '\0';
      pcVar78[5] = '\0';
      pcVar78[6] = '\0';
      pcVar78[7] = '\0';
      (*p_Var2)(pcVar13,pvVar1);
      pBVar15 = local_58;
      pcVar79 = local_f8 + lVar3 + -8;
      pcVar79[0] = -0x42;
      pcVar79[1] = -0x60;
      pcVar79[2] = '\x12';
      pcVar79[3] = '\0';
      pcVar79[4] = '\0';
      pcVar79[5] = '\0';
      pcVar79[6] = '\0';
      pcVar79[7] = '\0';
      buffer_destroy(pBVar15);
      pBVar15 = local_38;
      pcVar80 = local_f8 + lVar3 + -8;
      builtin_strncpy(local_f8 + lVar3 + -8,"Ǡ\x12",4);
      pcVar80[4] = '\0';
      pcVar80[5] = '\0';
      pcVar80[6] = '\0';
      pcVar80[7] = '\0';
      buffer_destroy(pBVar15);
      pcVar81 = local_f8 + lVar3 + -8;
      builtin_strncpy(local_f8 + lVar3 + -8,"Ҡ\x12",4);
      pcVar81[4] = '\0';
      pcVar81[5] = '\0';
      pcVar81[6] = '\0';
      pcVar81[7] = '\0';
      free_define(ctx,pDVar9);
      goto LAB_0012a0e4;
    }
    for (uVar14 = local_80 & 0xffffffff; (0 < (int)uVar14 && (pcVar13[uVar14 - 1] == ' '));
        uVar14 = uVar14 - 1) {
      pcVar13[uVar14 - 1] = '\0';
    }
    for (uVar14 = local_88 & 0xffffffff; (0 < (int)uVar14 && (pcVar12[uVar14 - 1] == ' '));
        uVar14 = uVar14 - 1) {
      pcVar12[uVar14 - 1] = '\0';
    }
    pDVar9->identifier = local_70->parameters[local_68];
    pDVar9->definition = pcVar13;
    pDVar9->original = pcVar12;
    pDVar9->next = defines;
    pBVar90 = local_38;
    defines = pDVar9;
    bVar94 = local_39;
  }
  lVar17 = local_68;
  bVar94 = (sVar11 == 0 && bVar4) & bVar94;
  pcVar40 = local_f8 + lVar3 + -8;
  pcVar40[0] = 'I';
  pcVar40[1] = -99;
  pcVar40[2] = '\x12';
  pcVar40[3] = '\0';
  pcVar40[4] = '\0';
  pcVar40[5] = '\0';
  pcVar40[6] = '\0';
  pcVar40[7] = '\0';
  buffer_destroy(pBVar90);
  pBVar15 = local_58;
  pcVar41 = local_f8 + lVar3 + -8;
  pcVar41[0] = 'R';
  pcVar41[1] = -99;
  pcVar41[2] = '\x12';
  pcVar41[3] = '\0';
  pcVar41[4] = '\0';
  pcVar41[5] = '\0';
  pcVar41[6] = '\0';
  pcVar41[7] = '\0';
  buffer_destroy(pBVar15);
  lVar17 = lVar17 + 1;
  uVar14 = local_50 & 0xffffffff;
  goto LAB_00129ab6;
}

Assistant:

static int handle_pp_identifier(Context *ctx)
{
    if (ctx->recursion_count++ >= 256)  // !!! FIXME: gcc can figure this out.
    {
        fail(ctx, "Recursing macros");
        return 0;
    } // if

    IncludeState *state = ctx->include_stack;
    const char *fname = state->filename;
    const unsigned int line = state->line;
    char *sym = (char *) alloca(state->tokenlen+1);
    memcpy(sym, state->token, state->tokenlen);
    sym[state->tokenlen] = '\0';

    // Is this identifier #defined?
    const Define *def = find_define(ctx, sym);
    if (def == NULL)
        return 0;   // just send the token through unchanged.
    else if (def->paramcount != 0)
        return handle_macro_args(ctx, sym, def);

    const size_t deflen = strlen(def->definition);
    return push_source(ctx, fname, def->definition, deflen, line, NULL);
}